

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

bool __thiscall
nlohmann::detail::
binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
::get_binary<unsigned_char>
          (binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
           *this,input_format_t format,uchar len,binary_t *result)

{
  byte *pbVar1;
  bool bVar2;
  uint uVar3;
  undefined7 in_register_00000011;
  byte bVar4;
  bool bVar5;
  uchar local_39;
  binary_t *local_38;
  
  if ((int)CONCAT71(in_register_00000011,len) == 0) {
    bVar5 = true;
  }
  else {
    bVar4 = 1;
    bVar5 = false;
    local_38 = result;
    do {
      this->chars_read = this->chars_read + 1;
      pbVar1 = (byte *)(this->ia).current._M_current;
      uVar3 = 0xffffffff;
      if (pbVar1 != (byte *)(this->ia).end._M_current) {
        uVar3 = (uint)*pbVar1;
        (this->ia).current._M_current = (char *)(pbVar1 + 1);
      }
      this->current = uVar3;
      bVar2 = unexpect_eof(this,format,"binary");
      if (!bVar2) {
        return bVar5;
      }
      local_39 = (uchar)this->current;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&local_38->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_39);
      bVar5 = len <= bVar4;
      bVar4 = bVar4 + 1;
    } while ((byte)(bVar4 - len) != '\x01');
  }
  return bVar5;
}

Assistant:

bool get_binary(const input_format_t format,
                    const NumberType len,
                    binary_t& result)
    {
        bool success = true;
        for (NumberType i = 0; i < len; i++)
        {
            get();
            if (JSON_HEDLEY_UNLIKELY(!unexpect_eof(format, "binary")))
            {
                success = false;
                break;
            }
            result.push_back(static_cast<std::uint8_t>(current));
        }
        return success;
    }